

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

void __thiscall
Js::JavascriptWeakMap::ExtractSnapObjectDataInto
          (JavascriptWeakMap *this,SnapObject *objData,SlabAllocator *alloc)

{
  anon_class_16_2_d00c9aed fn;
  int iVar1;
  void **ppvVar2;
  uint32 local_2c;
  SnapMapInfo *pSStack_28;
  uint32 mapCountEst;
  SnapMapInfo *smi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptWeakMap *this_local;
  
  smi = (SnapMapInfo *)alloc;
  alloc_local = (SlabAllocator *)objData;
  objData_local = (SnapObject *)this;
  pSStack_28 = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>(alloc)
  ;
  iVar1 = Size(this);
  local_2c = iVar1 * 2;
  pSStack_28->MapSize = 0;
  ppvVar2 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>
                      ((SlabAllocatorBase<0> *)smi,(ulong)(local_2c + 1));
  pSStack_28->MapKeyValueArray = ppvVar2;
  fn.mapCountEst = &local_2c;
  fn.smi = &stack0xffffffffffffffd8;
  Map<Js::JavascriptWeakMap::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject*,TTD::SlabAllocatorBase<0>&)::__0>
            (this,fn);
  if (pSStack_28->MapSize == 0) {
    pSStack_28->MapKeyValueArray = (TTDVar *)0x0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>
              ((SlabAllocatorBase<0> *)smi,(ulong)(local_2c + 1));
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>
              ((SlabAllocatorBase<0> *)smi,(ulong)pSStack_28->MapSize,(ulong)(local_2c + 1));
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
            ((SnapObject *)alloc_local,pSStack_28);
  return;
}

Assistant:

void JavascriptWeakMap::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapMapInfo* smi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>();
        uint32 mapCountEst = this->Size() * 2;

        smi->MapSize = 0;
        smi->MapKeyValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(mapCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            AssertMsg(smi->MapSize + 1 < mapCountEst, "We are writing junk");

            smi->MapKeyValueArray[smi->MapSize] = key;
            smi->MapKeyValueArray[smi->MapSize + 1] = value;
            smi->MapSize += 2;
        });

        if(smi->MapSize == 0)
        {
            smi->MapKeyValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(mapCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(smi->MapSize, mapCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapMapInfo*, TTD::NSSnapObjects::SnapObjectType::SnapMapObject>(objData, smi);
    }